

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5IndexExtractCol(u8 **pa,int n,int iCol)

{
  byte bVar1;
  uint in_EAX;
  uint uVar2;
  int iVar3;
  uchar *puVar4;
  uchar uVar5;
  uchar *puVar6;
  uchar *puVar7;
  uchar *puVar8;
  int iCurrent;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  puVar4 = *pa;
  puVar6 = puVar4 + n;
  puVar7 = puVar4;
  uVar2 = 0;
  while (puVar8 = puVar4, (int)uVar2 < iCol) {
    while (uVar5 = *puVar8, uVar5 != '\x01') {
      while (puVar8 = puVar8 + 1, (char)uVar5 < '\0') {
        uVar5 = *puVar8;
      }
      if (puVar6 <= puVar8) goto LAB_001921d2;
    }
    *pa = puVar8;
    puVar4 = puVar8 + 2;
    bVar1 = puVar8[1];
    uStack_38 = (ulong)CONCAT14(bVar1,(undefined4)uStack_38);
    puVar7 = puVar8;
    uVar2 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      uVar2 = sqlite3Fts5GetVarint32(puVar8 + 1,(u32 *)((long)&uStack_38 + 4));
      puVar4 = puVar8 + 1 + uVar2;
      uVar2 = uStack_38._4_4_;
    }
  }
  if (uVar2 == iCol) {
    while ((puVar4 < puVar6 && (uVar5 = *puVar4, uVar5 != '\x01'))) {
      while (puVar4 = puVar4 + 1, (char)uVar5 < '\0') {
        uVar5 = *puVar4;
      }
    }
    iVar3 = (int)puVar4 - (int)puVar7;
  }
  else {
LAB_001921d2:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int fts5IndexExtractCol(
  const u8 **pa,                  /* IN/OUT: Pointer to poslist */
  int n,                          /* IN: Size of poslist in bytes */
  int iCol                        /* Column to extract from poslist */
){
  int iCurrent = 0;               /* Anything before the first 0x01 is col 0 */
  const u8 *p = *pa;
  const u8 *pEnd = &p[n];         /* One byte past end of position list */

  while( iCol>iCurrent ){
    /* Advance pointer p until it points to pEnd or an 0x01 byte that is
    ** not part of a varint. Note that it is not possible for a negative
    ** or extremely large varint to occur within an uncorrupted position 
    ** list. So the last byte of each varint may be assumed to have a clear
    ** 0x80 bit.  */
    while( *p!=0x01 ){
      while( *p++ & 0x80 );
      if( p>=pEnd ) return 0;
    }
    *pa = p++;
    iCurrent = *p++;
    if( iCurrent & 0x80 ){
      p--;
      p += fts5GetVarint32(p, iCurrent);
    }
  }
  if( iCol!=iCurrent ) return 0;

  /* Advance pointer p until it points to pEnd or an 0x01 byte that is
  ** not part of a varint */
  while( p<pEnd && *p!=0x01 ){
    while( *p++ & 0x80 );
  }

  return p - (*pa);
}